

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O2

void Sbm_AddCardinConstrMerge(sat_solver *p,int *pVars,int lo,int hi,int r,int *pnVars)

{
  int *pnVars_00;
  int iVar1;
  int hi_00;
  int lo_00;
  int i;
  long lVar2;
  int k;
  long lVar3;
  lit Lits [2];
  int *local_40;
  ulong local_38;
  
  iVar1 = r * 2;
  if (iVar1 < hi - lo) {
    hi_00 = hi - r;
    local_40 = pnVars;
    Sbm_AddCardinConstrMerge(p,pVars,lo,hi_00,iVar1,pnVars);
    pnVars_00 = local_40;
    lo_00 = r + lo;
    local_38 = (ulong)(uint)r;
    Sbm_AddCardinConstrMerge(p,pVars,lo_00,hi,iVar1,local_40);
    k = lo + iVar1;
    for (i = lo_00; i < hi_00; i = i + iVar1) {
      Sbm_AddSorter(p,pVars,i,k,pnVars_00);
      k = k + iVar1;
    }
    lVar2 = (long)(int)local_38;
    for (lVar3 = (long)lo_00; lVar3 < hi_00 + -1; lVar3 = lVar3 + lVar2) {
      Lits[0] = Abc_Var2Lit(pVars[lVar3],0);
      Lits[1] = Abc_Var2Lit(pVars[lVar2 + lVar3],1);
      iVar1 = sat_solver_addclause(p,Lits,(lit *)&local_40);
      if (iVar1 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatMap.c"
                      ,0x141,
                      "void Sbm_AddCardinConstrMerge(sat_solver *, int *, int, int, int, int *)");
      }
    }
  }
  return;
}

Assistant:

static inline void Sbm_AddCardinConstrMerge( sat_solver * p, int * pVars, int lo, int hi, int r, int * pnVars )
{
    int i, step = r * 2;
    if ( step < hi - lo )
    {
        Sbm_AddCardinConstrMerge( p, pVars, lo, hi-r, step, pnVars );
        Sbm_AddCardinConstrMerge( p, pVars, lo+r, hi, step, pnVars );
        for ( i = lo+r; i < hi-r; i += step )
            Sbm_AddSorter( p, pVars, i, i+r, pnVars );
        for ( i = lo+r; i < hi-r-1; i += r )
        {
            lit Lits[2] = { Abc_Var2Lit(pVars[i], 0), Abc_Var2Lit(pVars[i+r], 1) };
            int Cid = sat_solver_addclause( p, Lits, Lits + 2 );
            assert( Cid );
        }
    }
}